

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

void Fraig_ManReportChoices(Fraig_Man_t *pMan)

{
  uint uVar1;
  uint uVar2;
  int LevelMax2;
  int LevelMax1;
  int i;
  int nChoices;
  int nChoiceNodes;
  Fraig_Node_t *pTemp;
  Fraig_Node_t *pNode;
  Fraig_Man_t *pMan_local;
  
  uVar1 = Fraig_GetMaxLevel(pMan);
  Fraig_MappingSetChoiceLevels(pMan,0);
  uVar2 = Fraig_GetMaxLevel(pMan);
  LevelMax1 = 0;
  i = 0;
  for (LevelMax2 = 0; LevelMax2 < pMan->vNodes->nSize; LevelMax2 = LevelMax2 + 1) {
    _nChoices = pMan->vNodes->pArray[LevelMax2];
    if ((_nChoices->pRepr == (Fraig_Node_t *)0x0) && (_nChoices->pNextE != (Fraig_Node_t *)0x0)) {
      i = i + 1;
      for (; _nChoices != (Fraig_Node_t *)0x0; _nChoices = _nChoices->pNextE) {
        LevelMax1 = LevelMax1 + 1;
      }
    }
  }
  printf("Maximum level: Original = %d. Reduced due to choices = %d.\n",(ulong)uVar1,(ulong)uVar2);
  printf("Choice stats:  Choice nodes = %d. Total choices = %d.\n",(ulong)(uint)i,
         (ulong)(uint)LevelMax1);
  return;
}

Assistant:

void Fraig_ManReportChoices( Fraig_Man_t * pMan )
{
    Fraig_Node_t * pNode, * pTemp;
    int nChoiceNodes, nChoices;
    int i, LevelMax1, LevelMax2;

    // report the number of levels
    LevelMax1 = Fraig_GetMaxLevel( pMan );
    Fraig_MappingSetChoiceLevels( pMan, 0 );
    LevelMax2 = Fraig_GetMaxLevel( pMan );

    // report statistics about choices
    nChoiceNodes = nChoices = 0;
    for ( i = 0; i < pMan->vNodes->nSize; i++ )
    {
        pNode = pMan->vNodes->pArray[i];
        if ( pNode->pRepr == NULL && pNode->pNextE != NULL )
        { // this is a choice node = the primary node that has equivalent nodes
            nChoiceNodes++;
            for ( pTemp = pNode; pTemp; pTemp = pTemp->pNextE )
                nChoices++;
        }
    }
    printf( "Maximum level: Original = %d. Reduced due to choices = %d.\n", LevelMax1, LevelMax2 );
    printf( "Choice stats:  Choice nodes = %d. Total choices = %d.\n", nChoiceNodes, nChoices );
}